

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

arg_lit * arg_litn(char *shortopts,char *longopts,int mincount,int maxcount,char *glossary)

{
  arg_lit *paVar1;
  
  paVar1 = (arg_lit *)malloc(0x68);
  if (paVar1 != (arg_lit *)0x0) {
    if (maxcount <= mincount) {
      maxcount = mincount;
    }
    (paVar1->hdr).flag = '\0';
    (paVar1->hdr).shortopts = shortopts;
    (paVar1->hdr).longopts = longopts;
    (paVar1->hdr).datatype = (char *)0x0;
    (paVar1->hdr).glossary = glossary;
    (paVar1->hdr).mincount = mincount;
    (paVar1->hdr).maxcount = maxcount;
    (paVar1->hdr).parent = paVar1;
    (paVar1->hdr).resetfn = arg_lit_resetfn;
    (paVar1->hdr).scanfn = arg_lit_scanfn;
    (paVar1->hdr).checkfn = arg_lit_checkfn;
    (paVar1->hdr).errorfn = arg_lit_errorfn;
    paVar1->count = 0;
  }
  return paVar1;
}

Assistant:

struct arg_lit * arg_litn(
	const char * shortopts,
	const char * longopts,
	int mincount,
	int maxcount,
	const char * glossary) {
	struct arg_lit * result;

	/* foolproof things by ensuring maxcount is not less than mincount */
	maxcount = (maxcount < mincount) ? mincount : maxcount;

	result = (struct arg_lit *)malloc(sizeof(struct arg_lit));

	if (result) {
		/* init the arg_hdr struct */
		result->hdr.flag      = 0;
		result->hdr.shortopts = shortopts;
		result->hdr.longopts  = longopts;
		result->hdr.datatype  = NULL;
		result->hdr.glossary  = glossary;
		result->hdr.mincount  = mincount;
		result->hdr.maxcount  = maxcount;
		result->hdr.parent    = result;
		result->hdr.resetfn   = (arg_resetfn *)arg_lit_resetfn;
		result->hdr.scanfn    = (arg_scanfn *)arg_lit_scanfn;
		result->hdr.checkfn   = (arg_checkfn *)arg_lit_checkfn;
		result->hdr.errorfn   = (arg_errorfn *)arg_lit_errorfn;

		/* init local variables */
		result->count = 0;
	}

	ARG_TRACE(("arg_litn() returns %p\n", result));
	return result;
}